

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceNodeCloud.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContactSurfaceNodeCloud::ChContactSurfaceNodeCloud
          (ChContactSurfaceNodeCloud *this,shared_ptr<chrono::ChMaterialSurface> *material,
          ChMesh *mesh)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<chrono::ChMaterialSurface> local_18;
  
  local_18.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  p_Var1 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  ChContactSurface::ChContactSurface(&this->super_ChContactSurface,&local_18,mesh);
  if (local_18.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ChContactSurface)._vptr_ChContactSurface =
       (_func_int **)&PTR__ChContactSurfaceNodeCloud_00b299e0;
  (this->vnodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vnodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vnodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vnodes_rot).
  super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vnodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vnodes_rot).
  super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vnodes_rot).
  super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vnodes_rot).
  super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ChContactSurfaceNodeCloud::ChContactSurfaceNodeCloud(std::shared_ptr<ChMaterialSurface> material, ChMesh* mesh)
    : ChContactSurface(material, mesh) {}